

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O3

int __thiscall
lossless_neural_sound::expression_compiler::expression::Element_variable::
structurally_compare_implementation(Element_variable *this,Expression_node *rt)

{
  _func_int **pp_Var1;
  Node *pNVar2;
  Node *pNVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  if (rt == (Expression_node *)0x0) {
    __assert_fail("rt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                  ,0x31a,
                  "virtual int lossless_neural_sound::expression_compiler::expression::Element_variable::structurally_compare_implementation(const Expression_node *) const"
                 );
  }
  pp_Var1 = (rt->super_Node)._vptr_Node;
  if (pp_Var1 == (_func_int **)&PTR__Node_00127c20) {
    iVar6 = std::__cxx11::string::compare((string *)&this->matrix_variable->name);
    if (iVar6 < 0) {
LAB_0011d5ab:
      uVar7 = 0xffffffff;
    }
    else {
      uVar7 = 1;
      if (iVar6 == 0) {
        bVar4 = 0;
        lVar8 = 0;
        do {
          pNVar2 = (Node *)(this->indexes)._M_elems[lVar8];
          pNVar3 = (&rt[1].super_Node.hash_next)[lVar8];
          if (pNVar2 < pNVar3) goto LAB_0011d5ab;
          bVar9 = (bool)((pNVar2 >= pNVar3 && pNVar2 != pNVar3) | bVar4);
          lVar8 = 1;
          bVar4 = 1;
        } while (!bVar9);
        uVar7 = (uint)(pNVar3 < pNVar2);
      }
    }
  }
  else {
    uVar5 = (*pp_Var1[6])(rt);
    uVar7 = 0xffffffff;
    if (uVar5 < 2) {
      uVar7 = (uint)(uVar5 == 0);
    }
  }
  return uVar7;
}

Assistant:

virtual int structurally_compare_implementation(const Expression_node *rt) const
        noexcept override
    {
        assert(rt);
        if(auto *variable = dynamic_cast<const Element_variable *>(rt))
        {
            int name_compare = matrix_variable->name.compare(variable->matrix_variable->name);
            if(name_compare < 0)
                return -1;
            if(name_compare > 0)
                return 1;
            for(std::size_t i = 0; i < indexes.size(); i++)
            {
                if(indexes[i] < variable->indexes[i])
                    return -1;
                if(indexes[i] > variable->indexes[i])
                    return 1;
            }
            return 0;
        }
        auto rt_kind = rt->get_kind();
        if(Kind::Element_variable < rt_kind)
            return -1;
        if(Kind::Element_variable > rt_kind)
            return 1;
        return 0;
    }